

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

idx_t duckdb::FindTypedRangeBound<long,duckdb::GreaterThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  WindowColumnIterator<long> __last;
  WindowColumnIterator<long> __first;
  bool bVar1;
  undefined8 uVar2;
  pointer in_RCX;
  pointer in_RDX;
  WindowCursor *in_RSI;
  WindowCursor *in_RDI;
  char in_R8B;
  ulong *in_stack_00000010;
  long second;
  long first;
  WindowColumnIterator<long> end;
  WindowColumnIterator<long> begin;
  long cur_val_1;
  long cur_val;
  OperationCompare<long,_duckdb::GreaterThan> comp;
  long val;
  string *in_stack_fffffffffffffe58;
  WindowColumnIterator<long> *in_stack_fffffffffffffe60;
  WindowCursor *in_stack_fffffffffffffe70;
  idx_t in_stack_fffffffffffffe78;
  WindowCursor *in_stack_fffffffffffffe80;
  allocator *paVar3;
  WindowColumnIterator<long> local_118;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  long *in_stack_ffffffffffffff00;
  WindowCursor *in_stack_ffffffffffffff08;
  WindowCursor *in_stack_ffffffffffffff10;
  WindowCursor *in_stack_ffffffffffffff18;
  WindowCursor *in_stack_ffffffffffffff20;
  allocator local_c9;
  string local_c8 [32];
  long local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [48];
  long local_68;
  long local_40;
  char local_29;
  pointer local_28;
  pointer local_20;
  WindowCursor *local_18;
  WindowCursor *local_10;
  ulong local_8;
  
  local_29 = in_R8B;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = WindowInputExpression::GetCell<long>
                       ((WindowInputExpression *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                       );
  OperationCompare<long,_duckdb::GreaterThan>::OperationCompare
            ((OperationCompare<long,_duckdb::GreaterThan> *)0x1a5af43);
  if (local_29 == '\a') {
    local_68 = WindowCursor::GetCell<long>
                         (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          (idx_t)in_stack_fffffffffffffe70);
    bVar1 = OperationCompare<long,_duckdb::GreaterThan>::operator()
                      ((OperationCompare<long,_duckdb::GreaterThan> *)in_stack_fffffffffffffe60,
                       (long *)in_stack_fffffffffffffe58,(long *)0x1a5af9e);
    if (bVar1) {
      local_9a = 1;
      uVar2 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"Invalid RANGE PRECEDING value",&local_99);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_9a = 0;
      __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  else {
    local_a8 = WindowCursor::GetCell<long>
                         (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          (idx_t)in_stack_fffffffffffffe70);
    bVar1 = OperationCompare<long,_duckdb::GreaterThan>::operator()
                      ((OperationCompare<long,_duckdb::GreaterThan> *)in_stack_fffffffffffffe60,
                       (long *)in_stack_fffffffffffffe58,(long *)0x1a5b0eb);
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar3 = &local_c9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c8,"Invalid RANGE FOLLOWING value",paVar3);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  WindowColumnIterator<long>::WindowColumnIterator
            ((WindowColumnIterator<long> *)&stack0xffffffffffffff20,local_10,local_20);
  WindowColumnIterator<long>::WindowColumnIterator
            ((WindowColumnIterator<long> *)&stack0xffffffffffffff10,local_18,local_28);
  if (*in_stack_00000010 < in_stack_00000010[1]) {
    if ((local_20 <= *in_stack_00000010) && (*in_stack_00000010 < local_28)) {
      in_stack_fffffffffffffe70 =
           (WindowCursor *)
           WindowCursor::GetCell<long>
                     (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                      (idx_t)in_stack_fffffffffffffe70);
      in_stack_ffffffffffffff08 = in_stack_fffffffffffffe70;
    }
    if ((local_20 < in_stack_00000010[1]) && (in_stack_00000010[1] < local_28)) {
      in_stack_ffffffffffffff00 =
           (long *)WindowCursor::GetCell<long>
                             (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                              (idx_t)in_stack_fffffffffffffe70);
      bVar1 = OperationCompare<long,_duckdb::GreaterThan>::operator()
                        ((OperationCompare<long,_duckdb::GreaterThan> *)in_stack_fffffffffffffe60,
                         (long *)in_stack_fffffffffffffe58,(long *)0x1a5b30c);
      if (!bVar1) {
        bVar1 = OperationCompare<long,_duckdb::GreaterThan>::operator()
                          ((OperationCompare<long,_duckdb::GreaterThan> *)in_stack_fffffffffffffe60,
                           (long *)in_stack_fffffffffffffe58,(long *)0x1a5b32d);
        if (!bVar1) {
          local_8 = in_stack_00000010[1];
          goto LAB_01a5b453;
        }
        UnsafeNumericCast<long,unsigned_long,void>((local_28 - in_stack_00000010[1]) - 1);
        WindowColumnIterator<long>::operator-=
                  (in_stack_fffffffffffffe60,(difference_type)in_stack_fffffffffffffe58);
      }
    }
  }
  OperationCompare<long,_duckdb::GreaterThan>::OperationCompare
            ((OperationCompare<long,_duckdb::GreaterThan> *)in_stack_fffffffffffffe60,
             (OperationCompare<long,_duckdb::GreaterThan> *)in_stack_fffffffffffffe58);
  __first.pos = (pointer)in_stack_ffffffffffffff20;
  __first.coll = in_stack_ffffffffffffff18;
  __last.pos = (pointer)in_stack_ffffffffffffff10;
  __last.coll = in_stack_ffffffffffffff08;
  local_118 = ::std::
              upper_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::GreaterThan>>
                        (__first,__last,in_stack_ffffffffffffff00,
                         (OperationCompare<long,_duckdb::GreaterThan> *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_8 = WindowColumnIterator::operator_cast_to_unsigned_long((WindowColumnIterator *)&local_118)
  ;
  OperationCompare<long,_duckdb::GreaterThan>::~OperationCompare
            ((OperationCompare<long,_duckdb::GreaterThan> *)0x1a5b426);
LAB_01a5b453:
  OperationCompare<long,_duckdb::GreaterThan>::~OperationCompare
            ((OperationCompare<long,_duckdb::GreaterThan> *)0x1a5b460);
  return local_8;
}

Assistant:

static idx_t FindTypedRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                                 const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                                 const idx_t chunk_idx, const FrameBounds &prev) {
	D_ASSERT(!boundary.CellIsNull(chunk_idx));
	const auto val = boundary.GetCell<T>(chunk_idx);

	OperationCompare<T, OP> comp;

	// Check that the value we are searching for is in range.
	if (range == WindowBoundary::EXPR_PRECEDING_RANGE) {
		//	Preceding but value past the current value
		const auto cur_val = range_hi.GetCell<T>(0, order_end - 1);
		if (comp(cur_val, val)) {
			throw OutOfRangeException("Invalid RANGE PRECEDING value");
		}
	} else {
		//	Following but value before the current value
		D_ASSERT(range == WindowBoundary::EXPR_FOLLOWING_RANGE);
		const auto cur_val = range_lo.GetCell<T>(0, order_begin);
		if (comp(val, cur_val)) {
			throw OutOfRangeException("Invalid RANGE FOLLOWING value");
		}
	}
	//	Try to reuse the previous bounds to restrict the search.
	//	This is only valid if the previous bounds were non-empty
	WindowColumnIterator<T> begin(range_lo, order_begin);
	WindowColumnIterator<T> end(range_hi, order_end);
	if (prev.start < prev.end) {
		if (order_begin <= prev.start && prev.start < order_end) {
			const auto first = range_lo.GetCell<T>(0, prev.start);
			if (FROM && !comp(val, first)) {
				// If prev.start == val and we are looking for a lower bound, then we are done
				if (!comp(first, val)) {
					return prev.start;
				}
				//	prev.start <= val, so we can start further forward
				begin += UnsafeNumericCast<int64_t>(prev.start - order_begin);
			}
		}
		if (order_begin < prev.end && prev.end < order_end) {
			const auto second = range_hi.GetCell<T>(0, prev.end - 1);
			if (!comp(second, val)) {
				//  If val == prev.end and we are looking for an upper bound, then we are done
				if (!FROM && !comp(val, second)) {
					return prev.end;
				}
				//	val <= prev.end, so we can end further back
				// (prev.second is the largest peer)
				end -= UnsafeNumericCast<int64_t>(order_end - prev.end - 1);
			}
		}
	}

	if (FROM) {
		return idx_t(std::lower_bound(begin, end, val, comp));
	} else {
		return idx_t(std::upper_bound(begin, end, val, comp));
	}
}